

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

void __thiscall Js::EntryPointInfo::DumpNativeThrowSpanSequence(EntryPointInfo *this)

{
  SmallSpanSequence *this_00;
  StatementData SVar1;
  int iVar2;
  BOOL BVar3;
  NativeEntryPointData *pNVar4;
  DWORD_PTR DVar5;
  ptrdiff_t pVar6;
  Type TVar7;
  long lVar8;
  Type index;
  undefined1 auStack_50 [8];
  SmallSpanSequenceIter iter;
  StatementData local_38;
  StatementData data;
  
  pNVar4 = GetNativeEntryPointData(this);
  this_00 = pNVar4->nativeThrowSpanSequence;
  if (this_00 != (SmallSpanSequence *)0x0) {
    DVar5 = GetNativeAddress(this);
    iter._8_8_ = this;
    pVar6 = GetCodeSize(this);
    TVar7 = 0;
    Output::Print(L"Native Throw Map: baseAddr: 0x%0Ix, size: 0x%Ix\nstatementId, offset range, address range\n"
                  ,DVar5,pVar6);
    if (this_00->pStatementBuffer != (GrowingUint32HeapArray *)0x0) {
      TVar7 = this_00->pStatementBuffer->count;
    }
    auStack_50._0_4_ = -1;
    auStack_50._4_4_ = 0;
    iter.accumulatedIndex = 0;
    iter.accumulatedSourceBegin = 0;
    if (0 < (int)TVar7) {
      index = 0;
      do {
        local_38.sourceBegin = 0;
        local_38.bytecodeBegin = 0;
        BVar3 = SmallSpanSequence::Item(this_00,index,(SmallSpanSequenceIter *)auStack_50,&local_38)
        ;
        SVar1 = local_38;
        if (BVar3 != 0) {
          iVar2 = local_38.bytecodeBegin;
          lVar8 = (long)local_38.bytecodeBegin;
          DVar5 = GetNativeAddress((EntryPointInfo *)iter._8_8_);
          Output::Print(L"S%4d, (%5d -----)  (0x%012Ix --------)\n",(ulong)SVar1 & 0xffffffff,
                        (ulong)(uint)iVar2,lVar8 + DVar5);
        }
        index = index + 1;
      } while (TVar7 != index);
    }
  }
  return;
}

Assistant:

void EntryPointInfo::DumpNativeThrowSpanSequence()
    {
        // Native Throw Map
        SmallSpanSequence * nativeThrowSpanSequence = this->GetNativeEntryPointData()->GetNativeThrowSpanSequence();
        if (nativeThrowSpanSequence)
        {
            Output::Print(_u("Native Throw Map: baseAddr: 0x%0Ix, size: 0x%Ix\nstatementId, offset range, address range\n"),
                          this->GetNativeAddress(),
                          this->GetCodeSize());

            int count = nativeThrowSpanSequence->Count();
            SmallSpanSequenceIter iter;
            for (int i = 0; i < count; i++)
            {
                StatementData data;
                if (nativeThrowSpanSequence->Item(i, iter, data))
                {
                    Output::Print(_u("S%4d, (%5d -----)  (0x%012Ix --------)\n"), data.sourceBegin, // statementIndex
                        data.bytecodeBegin, // nativeOffset
                        data.bytecodeBegin + this->GetNativeAddress());
                }
            }
        }
    }